

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypt.c
# Opt level: O2

int ulp_decrypt(ulp_ciphertext *ciphertext,ulp_private_key *priv_key,uint8_t **msg_p)

{
  int iVar1;
  uint64_t *in;
  uint8_t *out;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  size_t j;
  ulong uVar5;
  size_t i;
  ulong uVar6;
  long local_48;
  
  iVar1 = -1;
  if (priv_key != (ulp_private_key *)0x0 && ciphertext != (ulp_ciphertext *)0x0) {
    uVar4 = ciphertext->n;
    iVar1 = -2;
    if ((uVar4 == priv_key->n) && (uVar5 = ciphertext->l, uVar5 == priv_key->l)) {
      in = (uint64_t *)malloc(uVar5 * 8);
      out = (uint8_t *)malloc(((uVar5 >> 3) + 1) - (ulong)((uVar5 & 7) == 0));
      if ((in == (uint64_t *)0x0) || (out == (uint8_t *)0x0)) {
        free(in);
        free(out);
        iVar1 = -1;
      }
      else {
        local_48 = 0;
        for (uVar6 = 0; uVar6 < uVar5; uVar6 = uVar6 + 1) {
          uVar3 = ciphertext->c2[uVar6];
          in[uVar6] = uVar3;
          for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
            uVar2 = mulmod(*(uint64_t *)((long)priv_key->S + uVar5 * 8 + uVar4 * local_48),
                           ciphertext->c1[uVar5],priv_key->q);
            uVar3 = (uVar2 + uVar3) % priv_key->q;
            in[uVar6] = uVar3;
            uVar4 = priv_key->n;
          }
          uVar5 = priv_key->l;
          local_48 = local_48 + 8;
        }
        decode(in,out,uVar5,priv_key->q);
        free(in);
        *msg_p = out;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int ulp_decrypt(ulp_ciphertext* ciphertext, ulp_private_key* priv_key, uint8_t** msg_p) {

    if(ciphertext == NULL || priv_key == NULL)
        return -1;

    if(ciphertext->n != priv_key->n || ciphertext->l != priv_key->l)
        return -2;

    // compute number of bytes needed for storing the decrypted plaintext
    size_t num_bytes = priv_key->l / 8;
    if(num_bytes * 8 != priv_key->l)
        num_bytes++;

    // allocate memory
    uint64_t* tmp = malloc(priv_key->l * sizeof(priv_key->q));
    uint8_t* msg = malloc(num_bytes);
    if(tmp == NULL || msg == NULL) {
        free(tmp);
        free(msg);
        return -1;
    }

    // S * c1 + c2
    for(size_t i = 0; i < priv_key->l; i++) {
        tmp[i] = ciphertext->c2[i];
        for(size_t j = 0; j < priv_key->n; j++) {
            tmp[i] = (tmp[i] + mulmod(priv_key->S[i*priv_key->n + j], ciphertext->c1[j], priv_key->q)) % priv_key->q;
        }
    }

    // decode decrypted message
    decode(tmp, msg, priv_key->l, priv_key->q);

    // exit properly
    free(tmp);
    *msg_p = msg;
    return 0;

}